

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

timer_ptr __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::set_timer
          (connection<websocketpp::config::asio::transport_config> *this,long duration,
          timer_handler *callback)

{
  element_type *__args;
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>
  *handler;
  io_context *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  connection<websocketpp::config::asio::transport_config> *in_RSI;
  wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
  *in_RDI;
  timer_ptr tVar1;
  timer_ptr *new_timer;
  wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
  *__args_1;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffee0;
  strand *in_stack_fffffffffffffee8;
  
  __args_1 = in_RDI;
  std::ref<asio::io_context>(in_RCX);
  lib::asio::milliseconds((long)in_RCX);
  std::
  make_shared<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>,std::reference_wrapper<asio::io_context>,std::chrono::duration<long,std::ratio<1l,1000l>>>
            ((reference_wrapper<asio::io_context> *)in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  __args = std::
           __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ec9da);
  handler = (_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>
             *)std::
               __shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ec9f0);
  get_shared(in_RSI);
  std::
  bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*)(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::error_code_const&),std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>&,std::function<void(std::error_code_const&)>&,std::_Placeholder<1>const&>
            ((offset_in_connection<websocketpp::config::asio::transport_config>_to_subr *)in_RSI,
             (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
              *)__args,
             (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
              *)__args_1,(function<void_(const_std::error_code_&)> *)in_RDI,
             (_Placeholder<1> *)in_RCX);
  ::asio::io_context::strand::
  wrap<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::error_code_const&)>>
            (in_stack_fffffffffffffee8,handler);
  ::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
  ::
  async_wait<asio::detail::wrapped_handler<asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,std::function<void(std::error_code_const&)>,std::error_code_const&)>,asio::detail::is_continuation_if_running>>
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
              *)handler,
             (wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
              *)in_RSI);
  ::asio::detail::
  wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
  ::~wrapped_handler(in_RDI);
  std::
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>
  ::~_Bind((_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>
            *)0x2eca85);
  std::
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
  ::~shared_ptr((shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
                 *)0x2eca8f);
  tVar1.
  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  tVar1.
  super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)in_RDI;
  return (timer_ptr)
         tVar1.
         super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

timer_ptr set_timer(long duration, timer_handler callback) {
        timer_ptr new_timer = lib::make_shared<lib::asio::steady_timer>(
            lib::ref(*m_io_service),
            lib::asio::milliseconds(duration)
        );

        if (config::enable_multithreading) {
            new_timer->async_wait(m_strand->wrap(lib::bind(
                &type::handle_timer, get_shared(),
                new_timer,
                callback,
                lib::placeholders::_1
            )));
        } else {
            new_timer->async_wait(lib::bind(
                &type::handle_timer, get_shared(),
                new_timer,
                callback,
                lib::placeholders::_1
            ));
        }

        return new_timer;
    }